

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O1

SSL_SESSION * SSL_SESSION_copy_without_early_data(SSL_SESSION *session)

{
  _Head_base<0UL,_ssl_session_st_*,_false> _Var1;
  uint16_t uVar2;
  SSL_SESSION *in_RAX;
  pointer __p;
  UniquePtr<SSL_SESSION> copy;
  _Head_base<0UL,_ssl_session_st_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  uVar2 = bssl::ssl_session_protocol_version(session);
  if ((uVar2 < 0x304) || (session->ticket_max_early_data == 0)) {
    if (session != (SSL_SESSION *)0x0) {
      CRYPTO_refcount_inc((CRYPTO_refcount_t *)session);
    }
    local_18._M_head_impl = (SSL_SESSION *)0x0;
  }
  else {
    bssl::SSL_SESSION_dup((bssl *)&local_18,session,3);
    _Var1._M_head_impl = local_18._M_head_impl;
    if (local_18._M_head_impl == (SSL_SESSION *)0x0) {
      session = (SSL_SESSION *)0x0;
    }
    else {
      (local_18._M_head_impl)->ticket_max_early_data = 0;
      (local_18._M_head_impl)->field_0x1b8 =
           (local_18._M_head_impl)->field_0x1b8 & 0xfb | session->field_0x1b8 & 4;
      uVar2 = bssl::ssl_session_protocol_version(local_18._M_head_impl);
      session = local_18._M_head_impl;
      if ((0x303 < uVar2) && ((_Var1._M_head_impl)->ticket_max_early_data != 0)) {
        __assert_fail("!SSL_SESSION_early_data_capable(copy.get())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_session.cc"
                      ,0x402,"SSL_SESSION *SSL_SESSION_copy_without_early_data(SSL_SESSION *)");
      }
      local_18._M_head_impl = (SSL_SESSION *)0x0;
    }
  }
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_18);
  return session;
}

Assistant:

SSL_SESSION *SSL_SESSION_copy_without_early_data(SSL_SESSION *session) {
  if (!SSL_SESSION_early_data_capable(session)) {
    return UpRef(session).release();
  }

  bssl::UniquePtr<SSL_SESSION> copy =
      SSL_SESSION_dup(session, SSL_SESSION_DUP_ALL);
  if (!copy) {
    return nullptr;
  }

  copy->ticket_max_early_data = 0;
  // Copied sessions are non-resumable until they're completely filled in.
  copy->not_resumable = session->not_resumable;
  assert(!SSL_SESSION_early_data_capable(copy.get()));
  return copy.release();
}